

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

mcpl_generic_filehandle_t * mcpl_generic_fopen(char *filename)

{
  mcpl_generic_filehandle_t *in_RDI;
  char *unaff_retaddr;
  mcpl_generic_filehandle_t *res;
  
  mcpl_generic_fopen_try(unaff_retaddr);
  if (in_RDI->internal == (void *)0x0) {
    mcpl_error((char *)0x1092d6);
  }
  return in_RDI;
}

Assistant:

mcpl_generic_filehandle_t mcpl_generic_fopen( const char * filename )
{
  mcpl_generic_filehandle_t res = mcpl_generic_fopen_try(filename);
  if (!res.internal)
    mcpl_error("Unable to open file!");
  return res;
}